

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O0

Image * Test_Helper::uniformImage(uint8_t value,uint32_t width,uint32_t height,Image *reference)

{
  uint32_t in_ECX;
  int in_EDX;
  Image *in_RDI;
  undefined8 in_R8;
  undefined2 uVar1;
  uint32_t in_stack_ffffffffffffffe8;
  
  uVar1 = (undefined2)((ulong)in_R8 >> 0x30);
  if (in_EDX == 0) {
    anon_unknown.dwarf_a2ce3::randomSize();
  }
  if (in_ECX == 0) {
    anon_unknown.dwarf_a2ce3::randomSize();
  }
  anon_unknown.dwarf_a2ce3::generateImage
            (in_ECX,in_stack_ffffffffffffffe8,(uint8_t)((ushort)uVar1 >> 8),(uint8_t)uVar1,in_RDI);
  return in_RDI;
}

Assistant:

PenguinV_Image::Image uniformImage( uint8_t value, uint32_t width, uint32_t height, const PenguinV_Image::Image & reference )
    {
        return generateImage( (width > 0u) ? width : randomSize(), (height > 0u) ? height : randomSize(), PenguinV_Image::GRAY_SCALE, value, reference );
    }